

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerMSL::is_direct_input_builtin(CompilerMSL *this,BuiltIn bi_type)

{
  ExecutionModel EVar1;
  bool local_2d;
  bool local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  BuiltIn bi_type_local;
  CompilerMSL *this_local;
  
  if ((bi_type < 2) || (bi_type - BuiltInClipDistance < 2)) {
    return false;
  }
  if (1 < bi_type - BuiltInVertexId) {
    if (bi_type - BuiltInPrimitiveId < 2) {
      EVar1 = Compiler::get_execution_model((Compiler *)this);
      local_2a = 1;
      if (EVar1 == ExecutionModelTessellationControl) {
        local_2a = (this->msl_options).multi_patch_workgroup ^ 0xff;
      }
      return (bool)(local_2a & 1);
    }
    if (bi_type - BuiltInTessLevelOuter < 2) {
      return false;
    }
    if (bi_type == BuiltInPatchVertices) {
      return false;
    }
    if ((bi_type == BuiltInSamplePosition) || (bi_type == BuiltInHelperInvocation)) {
      return false;
    }
    if ((bi_type == BuiltInSubgroupSize) || (bi_type == BuiltInSubgroupLocalInvocationId)) {
      EVar1 = Compiler::get_execution_model((Compiler *)this);
      local_2c = true;
      if (EVar1 != ExecutionModelGLCompute) {
        EVar1 = Compiler::get_execution_model((Compiler *)this);
        local_2d = false;
        if (EVar1 == ExecutionModelFragment) {
          local_2d = Options::supports_msl_version(&this->msl_options,2,2,0);
        }
        local_2c = local_2d;
      }
      return local_2c;
    }
    if (1 < bi_type - BuiltInVertexIndex) {
      if (4 < bi_type - BuiltInSubgroupEqMask) {
        if (bi_type - BuiltInBaseVertex < 2) goto LAB_0040ee73;
        if (bi_type != BuiltInDeviceIndex) {
          if (bi_type == BuiltInViewIndex) {
            EVar1 = Compiler::get_execution_model((Compiler *)this);
            local_2b = 0;
            if ((EVar1 == ExecutionModelFragment) &&
               (local_2b = 0, ((this->msl_options).multiview & 1U) != 0)) {
              local_2b = (this->msl_options).multiview_layered_rendering;
            }
            return (bool)(local_2b & 1);
          }
          if (1 < bi_type - BuiltInBaryCoordNV) {
            return true;
          }
          return false;
        }
      }
      return false;
    }
  }
LAB_0040ee73:
  EVar1 = Compiler::get_execution_model((Compiler *)this);
  local_29 = 1;
  if (EVar1 == ExecutionModelVertex) {
    local_29 = (this->msl_options).vertex_for_tessellation ^ 0xff;
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool CompilerMSL::is_direct_input_builtin(BuiltIn bi_type)
{
	switch (bi_type)
	{
	// Vertex function in
	case BuiltInVertexId:
	case BuiltInVertexIndex:
	case BuiltInBaseVertex:
	case BuiltInInstanceId:
	case BuiltInInstanceIndex:
	case BuiltInBaseInstance:
		return get_execution_model() != ExecutionModelVertex || !msl_options.vertex_for_tessellation;
	// Tess. control function in
	case BuiltInPosition:
	case BuiltInPointSize:
	case BuiltInClipDistance:
	case BuiltInCullDistance:
	case BuiltInPatchVertices:
		return false;
	case BuiltInInvocationId:
	case BuiltInPrimitiveId:
		return get_execution_model() != ExecutionModelTessellationControl || !msl_options.multi_patch_workgroup;
	// Tess. evaluation function in
	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		return false;
	// Fragment function in
	case BuiltInSamplePosition:
	case BuiltInHelperInvocation:
	case BuiltInBaryCoordNV:
	case BuiltInBaryCoordNoPerspNV:
		return false;
	case BuiltInViewIndex:
		return get_execution_model() == ExecutionModelFragment && msl_options.multiview &&
		       msl_options.multiview_layered_rendering;
	// Any stage function in
	case BuiltInDeviceIndex:
	case BuiltInSubgroupEqMask:
	case BuiltInSubgroupGeMask:
	case BuiltInSubgroupGtMask:
	case BuiltInSubgroupLeMask:
	case BuiltInSubgroupLtMask:
		return false;
	case BuiltInSubgroupLocalInvocationId:
	case BuiltInSubgroupSize:
		return get_execution_model() == ExecutionModelGLCompute ||
		       (get_execution_model() == ExecutionModelFragment && msl_options.supports_msl_version(2, 2));
	default:
		return true;
	}
}